

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

optional<pbrt::Point2<float>_> __thiscall
pbrt::PortalImageInfiniteLight::ImageFromRender
          (PortalImageInfiniteLight *this,Vector3f wRender,Float *duv_dw)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar6;
  undefined4 in_register_00000014;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar11 [64];
  float __x;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vector3f VVar15;
  optional<pbrt::Point2<float>_> oVar16;
  float local_38;
  undefined1 extraout_var [60];
  
  auVar12 = wRender._8_56_;
  VVar15 = Frame::ToLocal((Frame *)(duv_dw + 0x32),wRender);
  __x = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  if (__x <= 0.0) {
    (this->super_LightBase).renderFromLight.m.m[0][1] = 0.0;
    (this->super_LightBase).type = DeltaPosition;
    *(Float *)((long)((this->super_LightBase).renderFromLight.m.m + 0) + 0) = 0.0;
    uVar6 = extraout_EDX;
  }
  else {
    fVar9 = VVar15.super_Tuple3<pbrt::Vector3,_float>.x;
    if ((float *)CONCAT44(in_register_00000014,in_EDX) != (float *)0x0) {
      auVar7._8_4_ = 0x3f800000;
      auVar7._0_8_ = 0x3f8000003f800000;
      auVar7._12_4_ = 0x3f800000;
      auVar14._0_4_ = fVar9 * fVar9;
      auVar14._4_4_ =
           VVar15.super_Tuple3<pbrt::Vector3,_float>.y * VVar15.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar14._8_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar14._12_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar14 = vsubps_avx(auVar7,auVar14);
      auVar7 = vmovshdup_avx(auVar14);
      *(float *)CONCAT44(in_register_00000014,in_EDX) =
           (auVar7._0_4_ * auVar14._0_4_ * 9.869605) / __x;
    }
    auVar7 = vmovshdup_avx(auVar10._0_16_);
    fVar9 = atan2f(fVar9,__x);
    local_38 = auVar7._0_4_;
    auVar11._0_4_ = atan2f(local_38,__x);
    auVar11._4_60_ = extraout_var;
    auVar5._4_4_ = extraout_XMM0_Db;
    auVar5._0_4_ = fVar9;
    auVar5._8_4_ = extraout_XMM0_Dc;
    auVar5._12_4_ = extraout_XMM0_Dd;
    auVar13._8_4_ = 0x3f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._12_4_ = 0x3f800000;
    *(undefined1 *)((this->super_LightBase).renderFromLight.m.m[0] + 1) = 1;
    auVar7 = vinsertps_avx(auVar5,auVar11._0_16_,0x10);
    auVar3._8_4_ = 0x3fc90fdb;
    auVar3._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar3._12_4_ = 0x3fc90fdb;
    auVar7 = vaddps_avx512vl(auVar7,auVar3);
    auVar4._8_4_ = 0x40490fdb;
    auVar4._0_8_ = 0x40490fdb40490fdb;
    auVar4._12_4_ = 0x40490fdb;
    auVar7 = vdivps_avx512vl(auVar7,auVar4);
    uVar2 = vcmpps_avx512vl(auVar7,ZEXT816(0) << 0x20,5);
    auVar7 = vminps_avx512vl(auVar13,auVar7);
    auVar8._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar7._4_4_;
    auVar8._0_4_ = (uint)((byte)uVar2 & 1) * auVar7._0_4_;
    auVar8._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar7._8_4_;
    auVar8._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar7._12_4_;
    uVar1 = vmovlps_avx(auVar8);
    (this->super_LightBase).type = (int)uVar1;
    *(int *)((long)((this->super_LightBase).renderFromLight.m.m + 0) + 0) =
         (int)((ulong)uVar1 >> 0x20);
    uVar6 = extraout_EDX_00;
  }
  oVar16._8_4_ = uVar6;
  oVar16.optionalValue =
       (aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)>)this;
  return oVar16;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Point2f> ImageFromRender(Vector3f wRender,
                                            Float *duv_dw = nullptr) const {
        Vector3f w = portalFrame.ToLocal(wRender);
        if (w.z <= 0)
            return {};
        // Compute Jacobian determinant of mapping $\roman{d}(u,v)/\roman{d}\omega$ if
        // needed
        if (duv_dw)
            *duv_dw = Sqr(Pi) * (1 - Sqr(w.x)) * (1 - Sqr(w.y)) / w.z;

        Float alpha = std::atan2(w.x, w.z), beta = std::atan2(w.y, w.z);
        DCHECK(!IsNaN(alpha + beta));
        return Point2f(Clamp((alpha + Pi / 2) / Pi, 0, 1),
                       Clamp((beta + Pi / 2) / Pi, 0, 1));
    }